

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getpass.c
# Opt level: O0

char * getpass_r(char *prompt,char *password,size_t buflen)

{
  _Bool _Var1;
  ssize_t sVar2;
  int local_30;
  int fd;
  _Bool disabled;
  ssize_t nread;
  size_t buflen_local;
  char *password_local;
  char *prompt_local;
  
  local_30 = open64("/dev/tty",0);
  if (local_30 == -1) {
    local_30 = 0;
  }
  _Var1 = ttyecho(false,local_30);
  fputs(prompt,_stderr);
  sVar2 = read(local_30,password,buflen);
  if (sVar2 < 1) {
    *password = '\0';
  }
  else {
    password[sVar2 + -1] = '\0';
  }
  if (_Var1) {
    fputs("\n",_stderr);
    ttyecho(true,local_30);
  }
  if (local_30 != 0) {
    close(local_30);
  }
  return password;
}

Assistant:

char *getpass_r(const char *prompt, /* prompt to display */
                char *password,     /* buffer to store password in */
                size_t buflen)      /* size of buffer to store password in */
{
  ssize_t nread;
  bool disabled;
  int fd = open("/dev/tty", O_RDONLY);
  if(-1 == fd)
    fd = STDIN_FILENO; /* use stdin if the tty couldn't be used */

  disabled = ttyecho(FALSE, fd); /* disable terminal echo */

  fputs(prompt, stderr);
  nread = read(fd, password, buflen);
  if(nread > 0)
    password[--nread] = '\0'; /* zero terminate where enter is stored */
  else
    password[0] = '\0'; /* got nothing */

  if(disabled) {
    /* if echo actually was disabled, add a newline */
    fputs("\n", stderr);
    (void)ttyecho(TRUE, fd); /* enable echo */
  }

  if(STDIN_FILENO != fd)
    close(fd);

  return password; /* return pointer to buffer */
}